

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

float rsg::anon_unknown_0::getWeight<rsg::ParenOp>
                (GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  float fVar2;
  float fVar3;
  
  if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
    iVar1 = state->m_expressionDepth + 2;
    fVar3 = 0.05;
  }
  else {
    iVar1 = getConservativeValueExprDepth(state,valueRange);
    iVar1 = iVar1 + state->m_expressionDepth + 1;
    fVar3 = 1.0;
  }
  fVar2 = 0.0;
  if (iVar1 <= state->m_shaderParams->maxExpressionDepth) {
    fVar2 = fVar3;
  }
  return fVar2;
}

Assistant:

Expression*	create		(GeneratorState& state, ConstValueRangeAccess valueRange)		{ return new T(state, valueRange);			}